

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O0

void add_codepoint(BMFONT_PARSER *parser,int codepoint)

{
  BMFONT_RANGE *pBVar1;
  int in_ESI;
  undefined8 *in_RDI;
  BMFONT_RANGE *range2;
  BMFONT_RANGE *range;
  BMFONT_RANGE *prev;
  BMFONT_DATA *data;
  ALLEGRO_FONT *font;
  BMFONT_RANGE *in_stack_ffffffffffffffc8;
  BMFONT_DATA *data_00;
  int codepoint_00;
  undefined4 in_stack_fffffffffffffff0;
  
  pBVar1 = (BMFONT_RANGE *)*in_RDI;
  data_00 = *(BMFONT_DATA **)(*(long *)pBVar1 + 0x10);
  while( true ) {
    codepoint_00 = (int)((ulong)*(long *)pBVar1 >> 0x20);
    if (data_00 == (BMFONT_DATA *)0x0) {
      insert_new_range((BMFONT_PARSER *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pBVar1,
                       codepoint_00);
      return;
    }
    if (in_ESI == data_00->pages_count + -1) {
      prepend_char((BMFONT_PARSER *)data_00,in_stack_ffffffffffffffc8);
      return;
    }
    if (in_ESI < data_00->pages_count) {
      insert_new_range((BMFONT_PARSER *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pBVar1,
                       codepoint_00);
      return;
    }
    if (in_ESI == data_00->pages_count + *(int *)&data_00->field_0x4) break;
    data_00 = (BMFONT_DATA *)data_00->range_first;
  }
  append_char((BMFONT_PARSER *)data_00,in_stack_ffffffffffffffc8);
  pBVar1 = data_00->range_first;
  if (pBVar1 == (BMFONT_RANGE *)0x0) {
    return;
  }
  if (in_ESI != pBVar1->first + -1) {
    return;
  }
  combine_ranges(data_00,pBVar1,(BMFONT_RANGE *)0x107e03);
  return;
}

Assistant:

static void add_codepoint(BMFONT_PARSER *parser, int codepoint) {
   ALLEGRO_FONT *font = parser->font;
   BMFONT_DATA *data = font->data;
   BMFONT_RANGE *prev = NULL;
   BMFONT_RANGE *range = data->range_first;
   while (range) {
      if (codepoint == range->first - 1) {
         prepend_char(parser, range);
         return;
      }
      if (codepoint < range->first) {
         insert_new_range(parser, prev, codepoint);
         return;
      }
      if (codepoint == range->first + range->count) {
         append_char(parser, range);
         BMFONT_RANGE *range2 = range->next;
         if (range2 != NULL && codepoint == range2->first - 1) {
            combine_ranges(data, range, range2);
         }
         return;
      }
      prev = range;
      range = range->next;
   }
   insert_new_range(parser, prev, codepoint);
}